

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::operator==
          (GaussianPlumeRecord *this,GaussianPlumeRecord *Value)

{
  KBOOL KVar1;
  GaussianPlumeRecord *Value_local;
  GaussianPlumeRecord *this_local;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = WorldCoordinates::operator!=(&this->m_SrcLocation,&Value->m_SrcLocation);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = Vector::operator!=(&this->m_PlumeLWH,&Value->m_PlumeLWH);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = Vector::operator!=(&this->m_DDTLEH,&Value->m_DDTLEH);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = WorldCoordinates::operator!=(&this->m_SrcLocation,&Value->m_SrcLocation);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32LdEdgeCenHght != (float)Value->m_f32LdEdgeCenHght) ||
                    (NAN((float)this->m_f32LdEdgeCenHght) || NAN((float)Value->m_f32LdEdgeCenHght)))
            {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = Vector::operator!=(&this->m_LdEdgeVel,&Value->m_LdEdgeVel);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GaussianPlumeRecord::operator == ( const GaussianPlumeRecord & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) )           return false;
    if( m_SrcLocation       != Value.m_SrcLocation )        return false;
    if( m_Ori               != Value.m_Ori )                return false;
    if( m_PlumeLWH          != Value.m_PlumeLWH )           return false;
    if( m_DDTLEH            != Value.m_DDTLEH )             return false;
    if( m_SrcLocation       != Value.m_SrcLocation )        return false;
    if( m_f32LdEdgeCenHght  != Value.m_f32LdEdgeCenHght )   return false;
    if( m_LdEdgeVel         != Value.m_LdEdgeVel )          return false;
    return true;
}